

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

string * __thiscall
google::protobuf::Message::ShortDebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  size_type sVar1;
  Printer printer;
  Printer local_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_20.use_short_repeated_primitives_ = false;
  local_20.utf8_string_escaping_ = false;
  local_20.initial_indent_level_ = 0;
  local_20.single_line_mode_ = true;
  TextFormat::Printer::PrintToString(&local_20,this,__return_storage_ptr__);
  sVar1 = __return_storage_ptr__->_M_string_length;
  if ((sVar1 != 0) && ((__return_storage_ptr__->_M_dataplus)._M_p[sVar1 - 1] == ' ')) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)sVar1 + -1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Message::ShortDebugString() const {
  string debug_string;

  TextFormat::Printer printer;
  printer.SetSingleLineMode(true);

  printer.PrintToString(*this, &debug_string);
  // Single line mode currently might have an extra space at the end.
  if (debug_string.size() > 0 &&
      debug_string[debug_string.size() - 1] == ' ') {
    debug_string.resize(debug_string.size() - 1);
  }

  return debug_string;
}